

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O2

TPZCompEl * __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>_>::Clone
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>_> *this,TPZCompMesh *mesh)

{
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>_> *this_00;
  
  this_00 = (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>_> *)operator_new(0x110);
  TPZCompElPostProc(this_00,mesh,this);
  return (TPZCompEl *)this_00;
}

Assistant:

inline TPZCompEl * TPZCompElPostProc<TCOMPEL>::Clone(TPZCompMesh &mesh) const{
    return new TPZCompElPostProc<TCOMPEL> (mesh, *this);
}